

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dummy_api.h
# Opt level: O0

const_buffer * __thiscall
dummy_api::format_output(dummy_api *this,const_buffer *in,bool param_3,error_code *param_4)

{
  long in_RSI;
  string *in_RDI;
  const_buffer *in_stack_ffffffffffffff78;
  const_buffer *in_stack_ffffffffffffffa0;
  const_buffer *in_stack_ffffffffffffffa8;
  
  if ((*(byte *)(in_RSI + 0x130) & 1) == 0) {
    *(undefined1 *)(in_RSI + 0x130) = 1;
    booster::aio::buffer(in_RDI);
    booster::aio::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    booster::aio::const_buffer::~const_buffer((const_buffer *)0x127837);
  }
  else {
    booster::aio::const_buffer::const_buffer((const_buffer *)in_RDI,in_stack_ffffffffffffff78);
  }
  return (const_buffer *)in_RDI;
}

Assistant:

booster::aio::const_buffer format_output(booster::aio::const_buffer const &in,bool,booster::system::error_code &)
	{
		if(headers_written_) {
			return in;
		}
		else {
			headers_written_ = true;
			return booster::aio::buffer(headers_) + in;
		}
	}